

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindBase.h
# Opt level: O3

void __thiscall
cmFindBaseDebugState::DebugLibState::DebugLibState(DebugLibState *this,string *n,string *p)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  (this->regexName)._M_dataplus._M_p = (pointer)&(this->regexName).field_2;
  pcVar3 = (n->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar3,pcVar3 + n->_M_string_length);
  paVar1 = &(this->path).field_2;
  (this->path)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (p->_M_dataplus)._M_p;
  paVar2 = &p->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&p->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->path).field_2 + 8) = uVar4;
  }
  else {
    (this->path)._M_dataplus._M_p = pcVar3;
    (this->path).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->path)._M_string_length = p->_M_string_length;
  (p->_M_dataplus)._M_p = (pointer)paVar2;
  p->_M_string_length = 0;
  (p->field_2)._M_local_buf[0] = '\0';
  return;
}

Assistant:

DebugLibState(std::string&& n, std::string p)
      : regexName(n)
      , path(std::move(p))
    {
    }